

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O3

uint64_t __thiscall
spvtools::opt::ScalarReplacementPass::GetArrayLength
          (ScalarReplacementPass *this,Instruction *arrayType)

{
  IRContext *pIVar1;
  DefUseManager *this_00;
  uint32_t id;
  Instruction *inst;
  Constant *this_01;
  uint64_t uVar2;
  uint uVar3;
  
  if (arrayType->opcode_ == OpTypeArray) {
    pIVar1 = (this->super_MemPass).super_Pass.context_;
    if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar1);
    }
    this_00 = (pIVar1->def_use_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    uVar3 = (arrayType->has_result_id_ & 1) + 1;
    if (arrayType->has_type_id_ == false) {
      uVar3 = (uint)arrayType->has_result_id_;
    }
    id = Instruction::GetSingleWordOperand(arrayType,uVar3 + 1);
    inst = analysis::DefUseManager::GetDef(this_00,id);
    pIVar1 = (this->super_MemPass).super_Pass.context_;
    if ((pIVar1->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
      IRContext::BuildConstantManager(pIVar1);
    }
    this_01 = analysis::ConstantManager::GetConstantFromInst
                        ((pIVar1->constant_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>.
                         _M_head_impl,inst);
    uVar2 = analysis::Constant::GetZeroExtendedValue(this_01);
    return uVar2;
  }
  __assert_fail("arrayType->opcode() == spv::Op::OpTypeArray",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp"
                ,0x236,
                "uint64_t spvtools::opt::ScalarReplacementPass::GetArrayLength(const Instruction *) const"
               );
}

Assistant:

uint64_t ScalarReplacementPass::GetArrayLength(
    const Instruction* arrayType) const {
  assert(arrayType->opcode() == spv::Op::OpTypeArray);
  const Instruction* length =
      get_def_use_mgr()->GetDef(arrayType->GetSingleWordInOperand(1u));
  return context()
      ->get_constant_mgr()
      ->GetConstantFromInst(length)
      ->GetZeroExtendedValue();
}